

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_write(Curl_easy *data,curl_socket_t sockfd,void *mem,size_t len,ssize_t *written)

{
  uint uVar1;
  ssize_t sVar2;
  int num;
  connectdata *conn;
  CURLcode result;
  ssize_t bytes_written;
  ssize_t *written_local;
  size_t len_local;
  void *mem_local;
  Curl_easy *pCStack_18;
  curl_socket_t sockfd_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  uVar1 = (uint)(sockfd == data->conn->sock[1]);
  bytes_written = (ssize_t)written;
  written_local = (ssize_t *)len;
  len_local = (size_t)mem;
  mem_local._4_4_ = sockfd;
  pCStack_18 = data;
  sVar2 = (*data->conn->send[(int)uVar1])(data,uVar1,mem,len,(CURLcode *)((long)&conn + 4));
  *(ssize_t *)bytes_written = sVar2;
  if (sVar2 < 0) {
    if (conn._4_4_ == CURLE_OK) {
      data_local._4_4_ = CURLE_SEND_ERROR;
    }
    else if (conn._4_4_ == CURLE_AGAIN) {
      *(undefined8 *)bytes_written = 0;
      data_local._4_4_ = CURLE_OK;
    }
    else {
      data_local._4_4_ = conn._4_4_;
    }
  }
  else {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_write(struct Curl_easy *data,
                    curl_socket_t sockfd,
                    const void *mem,
                    size_t len,
                    ssize_t *written)
{
  ssize_t bytes_written;
  CURLcode result = CURLE_OK;
  struct connectdata *conn;
  int num;
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  conn = data->conn;
  num = (sockfd == conn->sock[SECONDARYSOCKET]);

#ifdef CURLDEBUG
  {
    /* Allow debug builds to override this logic to force short sends
    */
    char *p = getenv("CURL_SMALLSENDS");
    if(p) {
      size_t altsize = (size_t)strtoul(p, NULL, 10);
      if(altsize)
        len = CURLMIN(len, altsize);
    }
  }
#endif
  bytes_written = conn->send[num](data, num, mem, len, &result);

  *written = bytes_written;
  if(bytes_written >= 0)
    /* we completely ignore the curlcode value when subzero is not returned */
    return CURLE_OK;

  /* handle CURLE_AGAIN or a send failure */
  switch(result) {
  case CURLE_AGAIN:
    *written = 0;
    return CURLE_OK;

  case CURLE_OK:
    /* general send failure */
    return CURLE_SEND_ERROR;

  default:
    /* we got a specific curlcode, forward it */
    return result;
  }
}